

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestProgramEnd(StreamingListener *this,UnitTest *unit_test)

{
  bool bVar1;
  string local_38;
  UnitTest *local_18;
  UnitTest *unit_test_local;
  StreamingListener *this_local;
  
  local_18 = unit_test;
  unit_test_local = (UnitTest *)this;
  bVar1 = UnitTest::Passed(unit_test);
  String::Format_abi_cxx11_(&local_38,"event=TestProgramEnd&passed=%d\n",(ulong)bVar1);
  Send(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  CloseConnection(this);
  return;
}

Assistant:

void OnTestProgramEnd(const UnitTest& unit_test) {
    // Note that Google Test current only report elapsed time for each
    // test iteration, not for the entire test program.
    Send(String::Format("event=TestProgramEnd&passed=%d\n",
                        unit_test.Passed()));

    // Notify the streaming server to stop.
    CloseConnection();
  }